

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_expr.cc
# Opt level: O0

void __thiscall Expr::GenEval(Expr *this,Output *out_cc,Env *env)

{
  bool bVar1;
  Expr *this_00;
  Type *pTVar2;
  ID *pIVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  char *pcVar6;
  Output *in_RDX;
  Expr *in_RSI;
  Env *in_RDI;
  int i;
  RecordField *rf_1;
  ID *id_1;
  int ty_size;
  ExceptionIDNotFound *e;
  Type *ty;
  RecordField *rf;
  ID *id;
  Type *ty0_1;
  string v1;
  string v0;
  string tmp;
  Type *ty0;
  Env *in_stack_fffffffffffffcf0;
  Env *in_stack_fffffffffffffcf8;
  Expr *in_stack_fffffffffffffd00;
  RecordField *in_stack_fffffffffffffd08;
  ID *in_stack_fffffffffffffd10;
  Env *in_stack_fffffffffffffd18;
  Output *in_stack_fffffffffffffd20;
  RecordField *in_stack_fffffffffffffd28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd30;
  ExprList *in_stack_fffffffffffffd38;
  Env *in_stack_fffffffffffffd48;
  ID *in_stack_fffffffffffffd50;
  int local_254;
  string local_250 [32];
  string local_230 [24];
  Env *in_stack_fffffffffffffe50;
  Output *in_stack_fffffffffffffe58;
  Expr *in_stack_fffffffffffffe60;
  Env *in_stack_fffffffffffffe70;
  Expr *in_stack_fffffffffffffe78;
  string local_180 [40];
  RecordField *local_158;
  ID *local_150;
  string local_148 [32];
  string local_128 [32];
  Type *local_108;
  allocator<char> local_f9;
  string local_f8 [39];
  allocator<char> local_d1;
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [48];
  string local_60 [32];
  string local_40 [32];
  Env *in_stack_ffffffffffffffe0;
  
  this_00 = (Expr *)(ulong)*(uint *)&in_RDI[1].id_map._M_t._M_impl;
  switch(this_00) {
  case (Expr *)0x0:
    bVar1 = Env::Evaluated((Env *)in_stack_fffffffffffffd08,(ID *)in_stack_fffffffffffffd00);
    if (!bVar1) {
      Env::Evaluate((Env *)in_stack_fffffffffffffd10,(Output *)in_stack_fffffffffffffd08,
                    (ID *)in_stack_fffffffffffffd00);
    }
    pcVar6 = Env::RValue(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
    std::__cxx11::string::operator=
              ((string *)&in_RDI[2].id_map._M_t._M_impl.super__Rb_tree_header,pcVar6);
    break;
  case (Expr *)0x1:
    pcVar6 = Number::Str((Number *)0x134500);
    std::__cxx11::string::operator=
              ((string *)&in_RDI[2].id_map._M_t._M_impl.super__Rb_tree_header,pcVar6);
    break;
  default:
    for (local_254 = 0; local_254 < 3; local_254 = local_254 + 1) {
      if (*(long *)(&in_RDI[1].id_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color +
                   (long)local_254 * 2) != 0) {
        GenEval(in_RSI,in_RDX,in_stack_ffffffffffffffe0);
      }
    }
    GenStrFromFormat(this_00,in_RDI);
    break;
  case (Expr *)0x4:
    GenEval(in_RSI,in_RDX,in_stack_ffffffffffffffe0);
    GenEval(in_RSI,in_RDX,in_stack_ffffffffffffffe0);
    EvalExpr(in_stack_fffffffffffffd00,(Output *)in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0
            );
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd30,(char *)in_stack_fffffffffffffd28,
               (allocator<char> *)in_stack_fffffffffffffd20);
    std::allocator<char>::~allocator(&local_d1);
    EvalExpr(in_stack_fffffffffffffd00,(Output *)in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0
            );
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd30,(char *)in_stack_fffffffffffffd28,
               (allocator<char> *)in_stack_fffffffffffffd20);
    std::allocator<char>::~allocator(&local_f9);
    local_108 = DataType(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
    if (local_108 == (Type *)0x0) {
      uVar4 = std::__cxx11::string::c_str();
      uVar5 = std::__cxx11::string::c_str();
      strfmt_abi_cxx11_((char *)local_148,"%s[%s]",uVar4,uVar5);
      std::__cxx11::string::operator=
                ((string *)&in_RDI[2].id_map._M_t._M_impl.super__Rb_tree_header,local_148);
      std::__cxx11::string::~string(local_148);
    }
    else {
      (*(local_108->super_DataDepElement)._vptr_DataDepElement[9])
                (local_128,local_108,local_d0,local_f8);
      std::__cxx11::string::operator=
                ((string *)&in_RDI[2].id_map._M_t._M_impl.super__Rb_tree_header,local_128);
      std::__cxx11::string::~string(local_128);
    }
    std::__cxx11::string::~string(local_f8);
    std::__cxx11::string::~string(local_d0);
    break;
  case (Expr *)0x5:
    GenEval(in_RSI,in_RDX,in_stack_ffffffffffffffe0);
    pTVar2 = DataType(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
    if (pTVar2 == (Type *)0x0) {
      Expr::id((Expr *)in_RDI[1].id_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
      pcVar6 = ID::Name((ID *)0x1346fb);
      strfmt_abi_cxx11_((char *)local_90,"->%s()",pcVar6);
      pcVar6 = EvalExpr(in_stack_fffffffffffffd00,(Output *)in_stack_fffffffffffffcf8,
                        in_stack_fffffffffffffcf0);
      uVar4 = std::__cxx11::string::c_str();
      strfmt_abi_cxx11_((char *)local_b0,"%s%s",pcVar6,uVar4);
      std::__cxx11::string::operator=
                ((string *)&in_RDI[2].id_map._M_t._M_impl.super__Rb_tree_header,local_b0);
      std::__cxx11::string::~string(local_b0);
      std::__cxx11::string::~string(local_90);
    }
    else {
      pcVar6 = EvalExpr(in_stack_fffffffffffffd00,(Output *)in_stack_fffffffffffffcf8,
                        in_stack_fffffffffffffcf0);
      pIVar3 = Expr::id((Expr *)in_RDI[1].id_map._M_t._M_impl.super__Rb_tree_header._M_header.
                                _M_parent);
      (*(pTVar2->super_DataDepElement)._vptr_DataDepElement[8])(local_60,pTVar2,pIVar3);
      uVar4 = std::__cxx11::string::c_str();
      strfmt_abi_cxx11_((char *)local_40,"%s%s",pcVar6,uVar4);
      std::__cxx11::string::operator=
                ((string *)&in_RDI[2].id_map._M_t._M_impl.super__Rb_tree_header,local_40);
      std::__cxx11::string::~string(local_40);
      std::__cxx11::string::~string(local_60);
    }
    break;
  case (Expr *)0x8:
    EvalExprList_abi_cxx11_
              (in_stack_fffffffffffffd38,(Output *)in_stack_fffffffffffffd30,
               (Env *)in_stack_fffffffffffffd28);
    std::__cxx11::string::operator=
              ((string *)&in_RDI[2].id_map._M_t._M_impl.super__Rb_tree_header,local_250);
    std::__cxx11::string::~string(local_250);
    break;
  case (Expr *)0x9:
    local_150 = Expr::id(*(Expr **)&in_RDI[1].id_map._M_t._M_impl.super__Rb_tree_header._M_header);
    local_158 = anon_unknown.dwarf_7075e::GetRecordField
                          (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    if (local_158 != (RecordField *)0x0) {
      pcVar6 = RecordField::FieldSize
                         (in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,
                          in_stack_fffffffffffffd18);
      strfmt_abi_cxx11_((char *)local_180,"%s",pcVar6);
      std::__cxx11::string::operator=
                ((string *)&in_RDI[2].id_map._M_t._M_impl.super__Rb_tree_header,local_180);
      std::__cxx11::string::~string(local_180);
    }
    break;
  case (Expr *)0xa:
    Expr::id(*(Expr **)&in_RDI[1].id_map._M_t._M_impl.super__Rb_tree_header._M_header);
    anon_unknown.dwarf_7075e::GetRecordField(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    pcVar6 = RecordField::FieldOffset
                       (in_stack_fffffffffffffd08,(Output *)in_stack_fffffffffffffd00,
                        in_stack_fffffffffffffcf8);
    strfmt_abi_cxx11_((char *)local_230,"%s",pcVar6);
    std::__cxx11::string::operator=
              ((string *)&in_RDI[2].id_map._M_t._M_impl.super__Rb_tree_header,local_230);
    std::__cxx11::string::~string(local_230);
    break;
  case (Expr *)0x21:
    GenCaseEval(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  }
  return;
}

Assistant:

void Expr::GenEval(Output* out_cc, Env* env)
	{
	switch ( expr_type_ )
		{
		case EXPR_NUM:
			str_ = num_->Str();
			break;

		case EXPR_ID:
			if ( ! env->Evaluated(id_) )
				env->Evaluate(out_cc, id_);
			str_ = env->RValue(id_);
			break;

		case EXPR_MEMBER:
			{
			/*
			For member expressions such X.Y, evaluating
			X only is sufficient. (Actually trying to
			evaluate Y will lead to error because Y is
			not defined in the current environment.)
			*/
			operand_[0]->GenEval(out_cc, env);

			Type* ty0 = operand_[0]->DataType(env);

			if ( ty0 )
				{
				str_ = strfmt("%s%s", operand_[0]->EvalExpr(out_cc, env),
				              ty0->EvalMember(operand_[1]->id()).c_str());
				}
			else
				{
				string tmp = strfmt("->%s()", operand_[1]->id()->Name());
				str_ = strfmt("%s%s", operand_[0]->EvalExpr(out_cc, env), tmp.c_str());
				}
			}
			break;

		case EXPR_SUBSCRIPT:
			{
			operand_[0]->GenEval(out_cc, env);
			operand_[1]->GenEval(out_cc, env);

			string v0 = operand_[0]->EvalExpr(out_cc, env);
			string v1 = operand_[1]->EvalExpr(out_cc, env);

			Type* ty0 = operand_[0]->DataType(env);
			if ( ty0 )
				str_ = ty0->EvalElement(v0, v1);
			else
				str_ = strfmt("%s[%s]", v0.c_str(), v1.c_str());
			}
			break;

		case EXPR_SIZEOF:
			{
			const ID* id = operand_[0]->id();
			RecordField* rf;
			Type* ty;

			try
				{
				if ( (rf = GetRecordField(id, env)) != nullptr )
					{
					str_ = strfmt("%s", rf->FieldSize(out_cc, env));
					}
				}
			catch ( ExceptionIDNotFound& e )
				{
				if ( (ty = TypeDecl::LookUpType(id)) != nullptr )
					{
					int ty_size = ty->StaticSize(global_env());
					if ( ty_size >= 0 )
						str_ = strfmt("%d", ty_size);
					else
						throw Exception(id, "unknown size");
					}
				else
					throw Exception(id, "not a record field or type");
				}
			}
			break;

		case EXPR_OFFSETOF:
			{
			const ID* id = operand_[0]->id();
			RecordField* rf = GetRecordField(id, env);
			str_ = strfmt("%s", rf->FieldOffset(out_cc, env));
			}
			break;

		case EXPR_CALLARGS:
			str_ = EvalExprList(args_, out_cc, env);
			break;

		case EXPR_CASE:
			GenCaseEval(out_cc, env);
			break;

		default:
			// Evaluate every operand by default
			for ( int i = 0; i < 3; ++i )
				if ( operand_[i] )
					operand_[i]->GenEval(out_cc, env);
			GenStrFromFormat(env);
			break;
		}
	}